

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O3

char * TextureTypeToString(aiTextureType in)

{
  if ((in < (aiTextureType_UNKNOWN|aiTextureType_DIFFUSE)) &&
     ((0x40fffU >> (in & (aiTextureType_DIFFUSE_ROUGHNESS|aiTextureType_METALNESS)) & 1) != 0)) {
    return &DAT_006a3708 + *(int *)(&DAT_006a3708 + (ulong)in * 4);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                ,0x34a,"const char *TextureTypeToString(aiTextureType)");
}

Assistant:

const char* TextureTypeToString(aiTextureType in)
{
	switch (in)
	{
	case aiTextureType_NONE:
		return "n/a";
	case aiTextureType_DIFFUSE:
		return "Diffuse";
	case aiTextureType_SPECULAR:
		return "Specular";
	case aiTextureType_AMBIENT:
		return "Ambient";
	case aiTextureType_EMISSIVE:
		return "Emissive";
	case aiTextureType_OPACITY:
		return "Opacity";
	case aiTextureType_NORMALS:
		return "Normals";
	case aiTextureType_HEIGHT:
		return "Height";
	case aiTextureType_SHININESS:
		return "Shininess";
	case aiTextureType_DISPLACEMENT:
		return "Displacement";
	case aiTextureType_LIGHTMAP:
		return "Lightmap";
	case aiTextureType_REFLECTION:
		return "Reflection";
	case aiTextureType_UNKNOWN:
		return "Unknown";
	default:
		break;
	}
	ai_assert(false); 
	return  "BUG";    
}